

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data.c
# Opt level: O3

int lyd_validate_value(lys_node *node,char *value)

{
  char *pcVar1;
  lys_type *plVar2;
  lys_node *plVar3;
  uint uVar4;
  lyd_node_leaf_list local_78;
  
  if ((node == (lys_node *)0x0) || ((node->nodetype & (LYS_LEAFLIST|LYS_LEAF)) == LYS_UNKNOWN)) {
    ly_log((ly_ctx *)0x0,LY_LLERR,LY_EINVAL,"Invalid arguments (%s()).","lyd_validate_value");
    uVar4 = 1;
  }
  else {
    pcVar1 = "";
    if (value != (char *)0x0) {
      pcVar1 = value;
    }
    local_78.value.binary = (char *)0x0;
    local_78.value_type = LY_TYPE_DER;
    local_78.value_flags = '\0';
    local_78._77_3_ = 0;
    local_78.hash = 0;
    local_78._52_4_ = 0;
    local_78.value_str = (char *)0x0;
    local_78.prev = (lyd_node *)0x0;
    local_78.parent = (lyd_node *)0x0;
    local_78.attr = (lyd_attr *)0x0;
    local_78.next = (lyd_node *)0x0;
    local_78.schema = (lys_node *)0x0;
    local_78.validity = '\0';
    local_78._9_7_ = 0;
    pcVar1 = lydict_insert(node->module->ctx,pcVar1,0);
    plVar3 = node;
    do {
      local_78.schema = node;
      local_78.value_str = pcVar1;
      if (*(LY_DATA_TYPE *)&plVar3[1].ref != LY_TYPE_LEAFREF) {
        local_78.value_type = *(LY_DATA_TYPE *)&plVar3[1].ref;
        plVar2 = lyp_parse_value((lys_type *)&plVar3[1].ref,&local_78.value_str,(lyxml_elem *)0x0,
                                 &local_78,(lyd_attr *)0x0,(lys_module *)0x0,0,0,0);
        uVar4 = (uint)(plVar2 == (lys_type *)0x0);
        pcVar1 = local_78.value_str;
        goto LAB_0016b462;
      }
      plVar3 = *(lys_node **)&plVar3[1].nodetype;
    } while (plVar3 != (lys_node *)0x0);
    local_78.value_type = LY_TYPE_LEAFREF;
    ly_log(node->module->ctx,LY_LLERR,LY_EINT,"Internal error (%s:%d).",
           "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/tree_data.c"
           ,0x14b3);
    uVar4 = 1;
LAB_0016b462:
    lydict_remove(node->module->ctx,pcVar1);
  }
  return uVar4;
}

Assistant:

API int
lyd_validate_value(struct lys_node *node, const char *value)
{
    struct lyd_node_leaf_list leaf;
    struct lys_node_leaf *sleaf = (struct lys_node_leaf*)node;
    int ret = EXIT_SUCCESS;

    if (!node || !(node->nodetype & (LYS_LEAF | LYS_LEAFLIST))) {
        LOGARG;
        return EXIT_FAILURE;
    }

    if (!value) {
        value = "";
    }

    /* dummy leaf */
    memset(&leaf, 0, sizeof leaf);
    leaf.value_str = lydict_insert(node->module->ctx, value, 0);

repeat:
    leaf.value_type = sleaf->type.base;
    leaf.schema = node;

    if (leaf.value_type == LY_TYPE_LEAFREF) {
        if (!sleaf->type.info.lref.target) {
            /* it should either be unresolved leafref (leaf.value_type are ORed flags) or it will be resolved */
            LOGINT(node->module->ctx);
            ret = EXIT_FAILURE;
            goto cleanup;
        }
        sleaf = sleaf->type.info.lref.target;
        goto repeat;
    } else {
        if (!lyp_parse_value(&sleaf->type, &leaf.value_str, NULL, &leaf, NULL, NULL, 0, 0, 0)) {
            ret = EXIT_FAILURE;
            goto cleanup;
        }
    }

cleanup:
    lydict_remove(node->module->ctx, leaf.value_str);
    return ret;
}